

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_map.hpp
# Opt level: O0

bool __thiscall tcmalloc::PageMap::Set(PageMap *this,uint64_t key,void *value)

{
  void ***pppvVar1;
  void **ppvVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t k3;
  uint64_t k2;
  uint64_t k1;
  void *value_local;
  uint64_t key_local;
  PageMap *this_local;
  
  uVar3 = key >> 0x2a;
  uVar4 = key >> 0x14 & 0x3fffff;
  if (this->roots[uVar3] == (void ***)0x0) {
    pppvVar1 = (void ***)Alloc(this,INTERNAL);
    this->roots[uVar3] = pppvVar1;
    if (this->roots[uVar3] == (void ***)0x0) {
      return false;
    }
  }
  if (this->roots[uVar3][uVar4] == (void **)0x0) {
    ppvVar2 = (void **)Alloc(this,LEAF);
    this->roots[uVar3][uVar4] = ppvVar2;
    if (this->roots[uVar3][uVar4] == (void **)0x0) {
      return false;
    }
  }
  this->roots[uVar3][uVar4][key & 0xfffff] = value;
  return true;
}

Assistant:

bool Set(uint64_t key, void *value) {
        uint64_t k1 = key >> (internal_bits + leaf_bits);
        uint64_t k2 = (key >> leaf_bits) & ((1<<internal_bits) - 1);
        uint64_t k3 = key & ((1<<leaf_bits) -1);
        if (roots[k1] == nullptr) {
            roots[k1] = reinterpret_cast<void ***>(Alloc(INTERNAL));
            if (roots[k1] == nullptr) {
                return false;
            }
        }
        if (roots[k1][k2] == nullptr) {
            roots[k1][k2] = reinterpret_cast<void **>(Alloc(LEAF));
            if (roots[k1][k2] == nullptr) {
                return false;
            }
        }
        roots[k1][k2][k3] = value;
        return true;
    }